

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherSetupData *setupData)

{
  this->fSetupData = setupData;
  (this->fMinusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fMinusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fMinusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003a74d0;
  (this->fPlusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fPlusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPlusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003a7688;
  (this->fPercent).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fPercent).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPercent).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003a75d8;
  (this->fPermille).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->fPermille).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPermille).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003a7630;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher(&this->fCurrency);
  CodePointMatcherWarehouse::CodePointMatcherWarehouse(&this->fCodePoints);
  return;
}

Assistant:

AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData)
        : fSetupData(setupData) {}